

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O2

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmMakefile *mf)

{
  _Impl *this_00;
  pointer p_Var1;
  string *extraout_RDX;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar2;
  __allocator_type __a2;
  string local_90;
  __shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [16];
  code *local_50;
  code *local_48;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  if (mf == (cmMakefile *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(undefined8 *)this = 0;
    p_Var1 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00992c08;
    local_40._M_alloc = &__a2;
    local_40._M_ptr = p_Var1;
    std::__shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_70,
                 &variablesManager->
                  super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                );
    std::__cxx11::string::string((string *)&local_90,(string *)name);
    this_00 = &p_Var1->_M_impl;
    local_48 = std::
               _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:544:51)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:544:51)>
               ::_M_manager;
    local_60._0_8_ = mf;
    cmDebuggerVariables::cmDebuggerVariables
              ((cmDebuggerVariables *)this_00,
               (shared_ptr<cmDebugger::cmDebuggerVariablesManager> *)&local_70,&local_90,
               supportsVariableType,
               (function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
                *)local_60);
    std::_Function_base::~_Function_base((_Function_base *)local_60);
    std::__cxx11::string::~string((string *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    local_40._M_ptr = (pointer)0x0;
    *(pointer *)(this + 8) = p_Var1;
    *(_Impl **)this = this_00;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<cmDebugger::cmDebuggerVariables,_std::allocator<cmDebugger::cmDebuggerVariables>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"ListFiles",(allocator<char> *)&local_70);
    CreateIfAny((cmDebuggerVariablesHelper *)local_60,variablesManager,&local_90,
                supportsVariableType,&mf->ListFiles);
    cmDebuggerVariables::AddSubVariables
              ((cmDebuggerVariables *)this_00,
               (shared_ptr<cmDebugger::cmDebuggerVariables> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"OutputFiles",(allocator<char> *)&local_70);
    CreateIfAny((cmDebuggerVariablesHelper *)local_60,variablesManager,&local_90,
                supportsVariableType,&mf->OutputFiles);
    cmDebuggerVariables::AddSubVariables
              ((cmDebuggerVariables *)this_00,
               (shared_ptr<cmDebugger::cmDebuggerVariables> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::__cxx11::string::~string((string *)&local_90);
    (p_Var1->_M_impl)._M_storage._M_storage.__data[0x88] = '\x01';
    cmMakefile::GetDirectoryId((cmDirectoryId *)&local_90,mf);
    cmDebuggerVariables::SetValue((cmDebuggerVariables *)this_00,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    name = extraout_RDX;
  }
  sVar2.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar2.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar2.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType, cmMakefile* mf)
{
  if (mf == nullptr) {
    return {};
  }

  auto AppleSDKTypeString = [&](cmMakefile::AppleSDK sdk) {
    switch (sdk) {
      case cmMakefile::AppleSDK::MacOS:
        return "MacOS";
      case cmMakefile::AppleSDK::IPhoneOS:
        return "IPhoneOS";
      case cmMakefile::AppleSDK::IPhoneSimulator:
        return "IPhoneSimulator";
      case cmMakefile::AppleSDK::AppleTVOS:
        return "AppleTVOS";
      case cmMakefile::AppleSDK::AppleTVSimulator:
        return "AppleTVSimulator";
      default:
        return "Unknown";
    }
  };

  auto variables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType, [=]() {
      std::vector<cmDebuggerVariableEntry> ret = {
        { "DefineFlags", mf->GetDefineFlags() },
        { "DirectoryId", mf->GetDirectoryId().String },
        { "IsRootMakefile", mf->IsRootMakefile() },
        { "HomeDirectory", mf->GetHomeDirectory() },
        { "HomeOutputDirectory", mf->GetHomeOutputDirectory() },
        { "CurrentSourceDirectory", mf->GetCurrentSourceDirectory() },
        { "CurrentBinaryDirectory", mf->GetCurrentBinaryDirectory() },
        { "PlatformIs32Bit", mf->PlatformIs32Bit() },
        { "PlatformIs64Bit", mf->PlatformIs64Bit() },
        { "PlatformIsx32", mf->PlatformIsx32() },
        { "AppleSDKType", AppleSDKTypeString(mf->GetAppleSDKType()) },
        { "PlatformIsAppleEmbedded", mf->PlatformIsAppleEmbedded() }
      };

      return ret;
    });

  variables->AddSubVariables(CreateIfAny(
    variablesManager, "ListFiles", supportsVariableType, mf->GetListFiles()));
  variables->AddSubVariables(CreateIfAny(variablesManager, "OutputFiles",
                                         supportsVariableType,
                                         mf->GetOutputFiles()));

  variables->SetIgnoreEmptyStringEntries(true);
  variables->SetValue(mf->GetDirectoryId().String);
  return variables;
}